

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O0

void __thiscall Bracket::display(Bracket *this,int indent)

{
  bool bVar1;
  ostream *poVar2;
  reference ppAVar3;
  Atom **i;
  iterator __end1;
  iterator __begin1;
  list<Atom_*,_std::allocator<Atom_*>_> *__range1;
  int indent_local;
  Bracket *this_local;
  
  printSpace(indent);
  poVar2 = std::operator<<((ostream *)&std::cout,"(");
  poVar2 = std::operator<<(poVar2,(string *)&this->func);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end1 = std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::begin(&this->para);
  i = (Atom **)std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::end(&this->para);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&i);
    if (!bVar1) break;
    ppAVar3 = std::_List_iterator<Atom_*>::operator*(&__end1);
    (*(*ppAVar3)->_vptr_Atom[2])(*ppAVar3,(ulong)(indent + 1));
    std::_List_iterator<Atom_*>::operator++(&__end1);
  }
  printSpace(indent);
  poVar2 = std::operator<<((ostream *)&std::cout,")");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Bracket::display(int indent) {
    printSpace(indent);
    std::cout << "(" << func << std::endl;
    for (auto &i: para) {
        i->display(indent + 1);
    }
    printSpace(indent);
    std::cout << ")" << std::endl;
}